

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall NavierStokesBase::post_timestep(NavierStokesBase *this,int crse_iteration)

{
  long lVar1;
  Real RVar2;
  undefined8 uVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  _Ios_Openmode _Var7;
  _Ios_Openmode _Var8;
  long lVar9;
  Box *pBVar10;
  FabFactory<amrex::FArrayBox> *pFVar11;
  FabArray<amrex::FArrayBox> *src;
  Vector<double,_std::allocator<double>_> *this_00;
  long *in_RDI;
  Real dt_level;
  ofstream ofs;
  string name;
  char buf [64];
  MultiFab mf;
  DistributionMapping dm;
  BoxArray ba;
  Box bx;
  int finest_level;
  BoxArray *in_stack_fffffffffffffa98;
  Amr *in_stack_fffffffffffffaa0;
  ostream *in_stack_fffffffffffffaa8;
  undefined4 in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  BoxArray *in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffac0;
  int in_stack_fffffffffffffac4;
  undefined8 in_stack_fffffffffffffac8;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 uVar12;
  BoxArray *pBVar13;
  CpOp in_stack_fffffffffffffae0;
  int iVar14;
  FabFactory<amrex::FArrayBox> *factory;
  char local_4c8 [456];
  Real *in_stack_fffffffffffffd00;
  Real *in_stack_fffffffffffffd08;
  Real *in_stack_fffffffffffffd10;
  Real *in_stack_fffffffffffffd18;
  NavierStokesBase *in_stack_fffffffffffffd20;
  string local_2c8 [32];
  char local_2a8 [64];
  undefined1 local_268 [456];
  FabFactory<amrex::FArrayBox> local_a0 [13];
  undefined8 local_38;
  undefined4 uStack_30;
  undefined4 local_2c;
  undefined4 uStack_28;
  undefined8 uStack_24;
  undefined4 local_10;
  
  local_10 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI[0x2a]);
  lVar4 = in_RDI[1];
  iVar6 = amrex::AmrMesh::finestLevel((AmrMesh *)in_RDI[0x2a]);
  if ((int)lVar4 == iVar6) {
    lVar4 = in_RDI[0x170];
    if (lVar4 != 0) {
      lVar1 = *(long *)(lVar4 + -8);
      for (lVar9 = lVar4 + lVar1 * 0x180; lVar4 != lVar9; lVar9 = lVar9 + -0x180) {
        amrex::MultiFab::~MultiFab((MultiFab *)0x7c5871);
      }
      operator_delete__((void *)(lVar4 + -8),lVar1 * 0x180 + 8);
    }
    in_RDI[0x170] = 0;
  }
  if ((do_reflux != 0) && ((int)in_RDI[1] < (int)local_10)) {
    (**(code **)(*in_RDI + 0x1a8))();
  }
  if ((int)in_RDI[1] < (int)local_10) {
    (**(code **)(*in_RDI + 0x160))();
  }
  if ((do_mac_proj != 0) && ((int)in_RDI[1] < (int)local_10)) {
    (**(code **)(*in_RDI + 0x1a0))();
  }
  if ((do_sync_proj != 0) && ((int)in_RDI[1] < (int)local_10)) {
    level_sync((NavierStokesBase *)ba.m_bat.m_op._4_8_,(int)ba.m_bat.m_op.m_indexType.m_typ.itype);
  }
  if ((((int)in_RDI[1] == 0) && (0 < sum_interval)) &&
     (iVar6 = amrex::Amr::levelSteps
                        (in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20)),
     iVar6 % sum_interval == 0)) {
    (**(code **)(*in_RDI + 0x1c0))();
  }
  if (0 < (int)in_RDI[1]) {
    incrPAvg((NavierStokesBase *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0));
  }
  amrex::BoxArray::operator=((BoxArray *)in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
  if (((int)in_RDI[1] == 0) && (-1 < (anonymous_namespace)::dump_plane)) {
    pBVar10 = amrex::Geometry::Domain((Geometry *)(in_RDI + 2));
    local_38 = *(undefined8 *)(pBVar10->smallend).vect;
    uVar3 = *(undefined8 *)((pBVar10->smallend).vect + 2);
    uStack_24 = *(undefined8 *)((pBVar10->bigend).vect + 2);
    uStack_28 = (undefined4)((ulong)*(undefined8 *)(pBVar10->bigend).vect >> 0x20);
    uStack_30 = (undefined4)uVar3;
    local_2c = (undefined4)((ulong)uVar3 >> 0x20);
    pBVar13 = (BoxArray *)&stack0xffffffffffffffc8;
    iVar14 = 2;
    amrex::Box::setSmall((Box *)pBVar13,2,(anonymous_namespace)::dump_plane);
    amrex::Box::setBig((Box *)pBVar13,iVar14,(anonymous_namespace)::dump_plane);
    factory = local_a0;
    amrex::BoxArray::BoxArray(pBVar13,(Box *)CONCAT44(iVar14,in_stack_fffffffffffffae0));
    amrex::ParallelDescriptor::NProcs();
    amrex::DistributionMapping::DistributionMapping
              ((DistributionMapping *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),
               in_stack_fffffffffffffab8,in_stack_fffffffffffffab4);
    iVar6 = (int)((ulong)in_stack_fffffffffffffab8 >> 0x20);
    local_268._16_8_ = 0;
    local_268._24_8_ = 0;
    local_268._0_8_ = 0;
    local_268._8_8_ = 0;
    local_268._32_8_ = 0;
    pBVar13 = (BoxArray *)local_268;
    amrex::MFInfo::MFInfo((MFInfo *)0x7c5ac9);
    pFVar11 = amrex::AmrLevel::Factory((AmrLevel *)in_stack_fffffffffffffaa0);
    amrex::MultiFab::MultiFab
              ((MultiFab *)CONCAT44(iVar14,in_stack_fffffffffffffae0),pBVar13,
               (DistributionMapping *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0),
               (int)((ulong)in_stack_fffffffffffffac8 >> 0x20),(int)in_stack_fffffffffffffac8,
               (MFInfo *)CONCAT44(in_stack_fffffffffffffac4,in_stack_fffffffffffffac0),factory);
    amrex::MFInfo::~MFInfo((MFInfo *)0x7c5b18);
    uVar12 = 0;
    src = &amrex::AmrLevel::get_new_data
                     ((AmrLevel *)in_stack_fffffffffffffaa0,(int)((ulong)pFVar11 >> 0x20))->
           super_FabArray<amrex::FArrayBox>;
    amrex::Periodicity::NonPeriodic();
    in_stack_fffffffffffffa98 = (BoxArray *)((ulong)pFVar11 & 0xffffffff00000000);
    amrex::FabArray<amrex::FArrayBox>::ParallelCopy
              ((FabArray<amrex::FArrayBox> *)CONCAT44(uVar12,in_stack_fffffffffffffad0),src,
               in_stack_fffffffffffffac4,in_stack_fffffffffffffac0,iVar6,
               (Periodicity *)CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
               in_stack_fffffffffffffae0);
    iVar6 = amrex::ParallelDescriptor::MyProc();
    amrex::FabArrayBase::DistributionMap((FabArrayBase *)(local_268 + 0x28));
    iVar14 = amrex::DistributionMapping::operator[]
                       ((DistributionMapping *)in_stack_fffffffffffffaa0,
                        (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    if (iVar6 == iVar14) {
      amrex::Vector<amrex::StateData,_std::allocator<amrex::StateData>_>::operator[]
                ((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                 in_stack_fffffffffffffaa0,(size_type)in_stack_fffffffffffffa98);
      RVar2 = amrex::StateData::curTime((StateData *)CONCAT44(iVar6,in_stack_fffffffffffffac0));
      sprintf(local_2a8,"%14.12e",SUB84(RVar2,0));
      std::__cxx11::string::string
                (local_2c8,(string *)(anonymous_namespace)::dump_plane_name_abi_cxx11_);
      std::__cxx11::string::operator+=(local_2c8,local_2a8);
      std::__cxx11::string::operator+=(local_2c8,".fab");
      std::ofstream::ofstream(local_4c8);
      _Var7 = std::__cxx11::string::c_str();
      _Var8 = std::operator|(_S_out,_S_trunc);
      _Var8 = std::operator|(_Var8,_S_bin);
      std::ofstream::open(local_4c8,_Var7);
      bVar5 = std::ios::good();
      uVar12 = CONCAT13(bVar5,(int3)in_stack_fffffffffffffab0);
      if ((bVar5 & 1) == 0) {
        amrex::FileOpenFailed((string *)pBVar13);
      }
      amrex::FabArray<amrex::FArrayBox>::operator[]
                ((FabArray<amrex::FArrayBox> *)in_stack_fffffffffffffaa0,
                 (int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
      amrex::FArrayBox::writeOn((FArrayBox *)CONCAT44(_Var8,uVar12),in_stack_fffffffffffffaa8);
      std::ofstream::~ofstream(local_4c8);
      std::__cxx11::string::~string(local_2c8);
    }
    amrex::MultiFab::~MultiFab((MultiFab *)0x7c5d95);
    amrex::DistributionMapping::~DistributionMapping((DistributionMapping *)0x7c5da2);
    amrex::BoxArray::~BoxArray((BoxArray *)in_stack_fffffffffffffaa0);
  }
  if (0 < avg_interval) {
    amrex::Amr::dtLevel(in_stack_fffffffffffffaa0,(int)((ulong)in_stack_fffffffffffffa98 >> 0x20));
    this_00 = (Vector<double,_std::allocator<double>_> *)
              amrex::Vector<double,_std::allocator<double>_>::operator[]
                        ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffaa0,
                         (size_type)in_stack_fffffffffffffa98);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              (this_00,(size_type)in_stack_fffffffffffffa98);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              (this_00,(size_type)in_stack_fffffffffffffa98);
    time_average(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
                 in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
  }
  return;
}

Assistant:

void
NavierStokesBase::post_timestep (int crse_iteration)
{
  BL_PROFILE("NavierStokesBase::post_timestep()");

    const int finest_level = parent->finestLevel();

#ifdef AMREX_PARTICLES
    post_timestep_particle (crse_iteration);
#endif

    if (level == parent->finestLevel())
    {
        delete [] u_mac;
        u_mac = 0;
    }

    if (do_reflux && level < finest_level)
        reflux();

    //
    // Average everything down, including P and Gradp.
    // Even though the multilevel projections average down, only
    // single level projections have been done for current timestep.
    // The linearity of the average ensures that if we average down P
    // and Gp here, then we may simply add the incremental correction
    // (which get averaged down in amrex) during the sync projection.
    //
    // avgDown also updates rho_ctime since it's needed for rho_half,
    // which is used in the sync projection.
    //
    if (level < finest_level)
        avgDown();

    if (do_mac_proj && level < finest_level)
        mac_sync();

    if (do_sync_proj && (level < finest_level))
        level_sync(crse_iteration);


    //
    // Test for conservation.
    //
    if (level==0 && sum_interval>0 && (parent->levelSteps(0)%sum_interval == 0))
    {
        sum_integrated_quantities();
    }

    if (level > 0) incrPAvg();

    old_intersect_new          = grids;

    if (level == 0 && dump_plane >= 0)
    {
        Box bx = geom.Domain();

        AMREX_ASSERT(bx.bigEnd(AMREX_SPACEDIM-1) >= dump_plane);

        bx.setSmall(AMREX_SPACEDIM-1, dump_plane);
        bx.setBig  (AMREX_SPACEDIM-1, dump_plane);

        BoxArray ba(bx);
        DistributionMapping dm{ba};

        MultiFab mf(ba, dm, AMREX_SPACEDIM, 0, MFInfo(), Factory());

        mf.ParallelCopy(get_new_data(State_Type), Xvel, 0, AMREX_SPACEDIM);

        if (ParallelDescriptor::MyProc() == mf.DistributionMap()[0])
        {
            char buf[64];
            sprintf(buf, "%14.12e", state[State_Type].curTime());

            std::string name(dump_plane_name);
            name += buf;
            name += ".fab";

            std::ofstream ofs;
            ofs.open(name.c_str(),std::ios::out|std::ios::trunc|std::ios::binary);
            if (!ofs.good())
                amrex::FileOpenFailed(name);

            mf[0].writeOn(ofs);
        }
    }

    if (avg_interval > 0)
    {
      const amrex::Real dt_level = parent->dtLevel(level);
      time_average(time_avg[level], time_avg_fluct[level], dt_avg[level], dt_level);
    }

}